

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_advsound.cpp
# Opt level: O0

void Cmd_playersounds(FCommandLine *argv,APlayerPawn *who,int key)

{
  ushort uVar1;
  undefined8 uVar2;
  uint uVar3;
  int iVar4;
  FPlayerClassLookup *pFVar5;
  char *pcVar6;
  FPlayerSoundHashTable *this;
  sfxinfo_t *psVar7;
  bool bVar8;
  int local_834;
  int l;
  int k;
  int j;
  uint i;
  char *reserveNames [256];
  int key_local;
  APlayerPawn *who_local;
  FCommandLine *argv_local;
  
  memset(&j,0,0x800);
  l = 0;
  k = 0;
  while( true ) {
    bVar8 = false;
    if (l < NumPlayerReserves) {
      uVar3 = TArray<sfxinfo_t,_sfxinfo_t>::Size(&S_sfx);
      bVar8 = (uint)k < uVar3;
    }
    if (!bVar8) break;
    psVar7 = TArray<sfxinfo_t,_sfxinfo_t>::operator[](&S_sfx,(ulong)(uint)k);
    if ((*(ushort *)&psVar7->field_0x30 >> 1 & 1) != 0) {
      l = l + 1;
      psVar7 = TArray<sfxinfo_t,_sfxinfo_t>::operator[](&S_sfx,(ulong)(uint)k);
      pcVar6 = FString::operator_cast_to_char_(&psVar7->name);
      psVar7 = TArray<sfxinfo_t,_sfxinfo_t>::operator[](&S_sfx,(ulong)(uint)k);
      *(char **)(&j + (ulong)psVar7->link * 2) = pcVar6;
    }
    k = k + 1;
  }
  for (k = 0; uVar3 = TArray<FPlayerClassLookup,_FPlayerClassLookup>::Size(&PlayerClassLookups),
      (uint)k < uVar3; k = k + 1) {
    for (l = 0; l < 3; l = l + 1) {
      pFVar5 = TArray<FPlayerClassLookup,_FPlayerClassLookup>::operator[]
                         (&PlayerClassLookups,(ulong)(uint)k);
      uVar1 = pFVar5->ListIndex[l];
      if (uVar1 != 0xffff) {
        pFVar5 = TArray<FPlayerClassLookup,_FPlayerClassLookup>::operator[]
                           (&PlayerClassLookups,(ulong)(uint)k);
        pcVar6 = FString::GetChars(&pFVar5->Name);
        Printf("\n%s, %s:\n",pcVar6,GenderNames[l]);
        for (local_834 = 0; local_834 < NumPlayerReserves; local_834 = local_834 + 1) {
          uVar2 = *(undefined8 *)(&j + (long)local_834 * 2);
          this = TArray<FPlayerSoundHashTable,_FPlayerSoundHashTable>::operator[]
                           (&PlayerSounds,(long)(int)(uint)uVar1);
          iVar4 = FPlayerSoundHashTable::LookupSound(this,local_834);
          psVar7 = TArray<sfxinfo_t,_sfxinfo_t>::operator[](&S_sfx,(long)iVar4);
          pcVar6 = FString::GetChars(&psVar7->name);
          Printf(" %-16s%s\n",uVar2,pcVar6);
        }
      }
    }
  }
  return;
}

Assistant:

CCMD (playersounds)
{
	const char *reserveNames[256];
	unsigned int i;
	int j, k, l;

	// Find names for the player sounds
	memset (reserveNames, 0, sizeof(reserveNames));
	for (i = j = 0; j < NumPlayerReserves && i < S_sfx.Size(); ++i)
	{
		if (S_sfx[i].bPlayerReserve)
		{
			++j;
			reserveNames[S_sfx[i].link] = S_sfx[i].name;
		}
	}

	for (i = 0; i < PlayerClassLookups.Size(); ++i)
	{
		for (j = 0; j < 3; ++j)
		{
			if ((l = PlayerClassLookups[i].ListIndex[j]) != 0xffff)
			{
				Printf ("\n%s, %s:\n", PlayerClassLookups[i].Name.GetChars(), GenderNames[j]);
				for (k = 0; k < NumPlayerReserves; ++k)
				{
					Printf (" %-16s%s\n", reserveNames[k], S_sfx[PlayerSounds[l].LookupSound (k)].name.GetChars());
				}
			}
		}
	}
}